

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int formatf(void *userp,_func_int_uchar_void_ptr *stream,char *format,__va_list_tag *ap_save)

{
  double dVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  anon_union_8_5_b978c7c5_for_val *paVar14;
  ulong uVar15;
  uint uVar16;
  uchar *__s;
  long lVar17;
  ulong uVar18;
  size_t sVar19;
  FormatType FVar20;
  int *piVar21;
  anon_union_8_5_b978c7c5_for_val aVar22;
  uint *puVar23;
  anon_union_8_5_b978c7c5_for_val *paVar24;
  byte bVar25;
  char *pcVar26;
  uint uVar27;
  size_t sVar28;
  ulong uVar29;
  byte *buffer;
  char *pcVar30;
  uint uVar31;
  int iVar32;
  ulong uStack_1a10;
  uint local_1a04;
  char *local_1a00;
  uint local_19e0;
  char *local_19d8;
  bool local_19c8;
  uint local_19c0;
  char formatbuf [32];
  char work [326];
  va_input input [128];
  outsegment output [128];
  
  work[0] = '\0';
  work[1] = '\0';
  work[2] = '\0';
  work[3] = '\0';
  work[4] = '\0';
  work[5] = '\0';
  work[6] = '\0';
  work[7] = '\0';
  work[8] = '\0';
  work[9] = '\0';
  work[10] = '\0';
  work[0xb] = '\0';
  work[0xc] = '\0';
  work[0xd] = '\0';
  work[0xe] = '\0';
  work[0xf] = '\0';
  uVar8 = 0xffffffff;
  local_19e0 = 0xffffffff;
  iVar10 = 0;
  local_19c0 = 0;
  formatbuf._0_8_ = format;
  uVar16 = 0;
switchD_0013db80_caseD_68:
  if (*(char *)formatbuf._0_8_ == '%') {
    local_1a00 = (char *)(formatbuf._0_8_ + 1);
    if (*(char *)(formatbuf._0_8_ + 1) == '%') {
      uVar6 = uVar16;
      if (local_1a00 + ~(ulong)format != (char *)0x0) {
        if (0x7f < (int)uVar16) {
          return 0;
        }
        uVar6 = uVar16 + 1;
        output[(int)uVar16].flags = 0x100000;
        output[(int)uVar16].input = 0;
        output[(int)uVar16].start = format;
        output[(int)uVar16].outlen = (size_t)(local_1a00 + ~(ulong)format);
      }
      formatbuf._0_8_ = formatbuf._0_8_ + 2;
      format = local_1a00;
      uVar16 = uVar6;
      goto switchD_0013db80_caseD_68;
    }
    uVar15 = 0;
    bVar3 = false;
    uVar6 = uVar8;
    iVar32 = 1;
    formatbuf._0_8_ = local_1a00;
    if (iVar10 != 1) {
      uVar6 = dollarstring(local_1a00,(char **)formatbuf);
      if ((int)uVar6 < 0) {
        if (iVar10 == 2) {
          return 0;
        }
        bVar3 = false;
        uVar6 = uVar8;
      }
      else {
        bVar3 = true;
        iVar32 = 2;
      }
    }
    iVar10 = iVar32;
    bVar4 = true;
    uVar7 = 0;
    uVar31 = 0;
LAB_0013d8ff:
    FVar20 = FORMAT_PTR;
    uVar13 = (uint)uVar15;
    if (bVar4) {
      pcVar30 = (char *)(formatbuf._0_8_ + 1);
      bVar5 = *(byte *)formatbuf._0_8_;
      switch(bVar5) {
      case 0x20:
        uVar31 = uVar31 | 1;
        bVar4 = true;
        formatbuf._0_8_ = pcVar30;
        goto LAB_0013d8ff;
      case 0x21:
      case 0x22:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2c:
      case 0x2f:
switchD_0013d92a_caseD_21:
        bVar4 = false;
        goto LAB_0013d8ff;
      case 0x23:
        uVar31 = uVar31 | 8;
        bVar4 = true;
        formatbuf._0_8_ = pcVar30;
        goto LAB_0013d8ff;
      case 0x2a:
        uVar31 = uVar31 | 0x4000;
        uVar15 = 0xffffffff;
        bVar4 = true;
        formatbuf._0_8_ = pcVar30;
        if (bVar3) {
          uVar13 = dollarstring(pcVar30,(char **)formatbuf);
          uVar15 = (ulong)uVar13;
          bVar4 = true;
          if ((int)uVar13 < 0) {
            return 0;
          }
        }
        goto LAB_0013d8ff;
      case 0x2b:
        uVar31 = uVar31 | 2;
        bVar4 = true;
        formatbuf._0_8_ = pcVar30;
        goto LAB_0013d8ff;
      case 0x2d:
        uVar31 = uVar31 & 0xfffffefb | 4;
        bVar4 = true;
        formatbuf._0_8_ = pcVar30;
        goto LAB_0013d8ff;
      case 0x2e:
        cVar2 = *pcVar30;
        if (cVar2 == '*') {
          uVar31 = uVar31 | 0x10000;
          formatbuf._0_8_ = formatbuf._0_8_ + 2;
          uVar7 = uVar8;
          if ((bVar3) &&
             (uVar7 = dollarstring((char *)formatbuf._0_8_,(char **)formatbuf), (int)uVar7 < 0)) {
            return 0;
          }
        }
        else {
          uVar31 = uVar31 | 0x8000;
          pcVar26 = (char *)(formatbuf._0_8_ + 2);
          formatbuf._0_8_ = pcVar30;
          if (cVar2 == '-') {
            formatbuf._0_8_ = pcVar26;
          }
          uVar13 = 0;
          for (; (byte)(*(char *)formatbuf._0_8_ - 0x30U) < 10;
              formatbuf._0_8_ = formatbuf._0_8_ + 1) {
            if (0xccccccc < (int)uVar13) {
              return 0;
            }
            uVar13 = (uint)(byte)(*(char *)formatbuf._0_8_ - 0x30U) + uVar13 * 10;
          }
          uVar7 = -uVar13;
          if (cVar2 != '-') {
            uVar7 = uVar13;
          }
        }
        bVar4 = true;
        if ((~uVar31 & 0x18000) == 0) {
          return 0;
        }
        goto LAB_0013d8ff;
      case 0x30:
        uVar31 = uVar31 | (~uVar31 & 4) << 6;
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        uVar31 = uVar31 | 0x2000;
        uVar15 = 0;
        do {
          if (0xccccccc < (int)uVar15) {
            return 0;
          }
          uVar15 = (ulong)(((uint)bVar5 + (int)uVar15 * 10) - 0x30);
          bVar5 = *(byte *)(formatbuf._0_8_ + 1);
          formatbuf._0_8_ = formatbuf._0_8_ + 1;
        } while ((byte)(bVar5 - 0x30) < 10);
        bVar4 = true;
        goto LAB_0013d8ff;
      }
      if (bVar5 == 0x4c) {
        uVar31 = uVar31 | 0x80;
        bVar4 = true;
        formatbuf._0_8_ = pcVar30;
      }
      else {
        if (bVar5 == 0x4f) goto LAB_0013dad4;
        if (bVar5 != 0x68) {
          if (bVar5 == 0x6c) {
            if ((uVar31 & 0x20) != 0) goto LAB_0013dadf;
          }
          else {
            if (bVar5 == 0x71) {
LAB_0013dadf:
              uVar31 = uVar31 | 0x40;
              bVar4 = true;
              formatbuf._0_8_ = pcVar30;
              goto LAB_0013d8ff;
            }
            if (bVar5 != 0x7a) goto switchD_0013d92a_caseD_21;
          }
LAB_0013dad4:
          uVar31 = uVar31 | 0x20;
          bVar4 = true;
          formatbuf._0_8_ = pcVar30;
          goto LAB_0013d8ff;
        }
        uVar31 = uVar31 | 0x10;
        bVar4 = true;
        formatbuf._0_8_ = pcVar30;
      }
      goto LAB_0013d8ff;
    }
    cVar2 = *(char *)formatbuf._0_8_;
    switch(cVar2) {
    case 'c':
      uVar31 = uVar31 | 0x20000;
      goto LAB_0013dc87;
    case 'd':
    case 'i':
      if ((uVar31 & 0x40) == 0) {
        FVar20 = FORMAT_LONG - ((uVar31 & 0x20) == 0);
      }
      else {
        FVar20 = FORMAT_LONGLONG;
      }
      break;
    case 'e':
      uVar31 = uVar31 | 0x40000;
      goto LAB_0013dcf3;
    case 'f':
      goto LAB_0013dcf3;
    case 'g':
      uVar31 = uVar31 | 0x80000;
      goto LAB_0013dcf3;
    case 'h':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'q':
    case 'r':
    case 't':
    case 'v':
    case 'w':
      goto switchD_0013db80_caseD_68;
    case 'n':
      FVar20 = FORMAT_INTPTR;
      break;
    case 'o':
      uVar31 = uVar31 | 0x400;
LAB_0013dc87:
      FVar20 = FORMAT_INT;
      break;
    case 'p':
      break;
    case 's':
LAB_0013ded1:
      FVar20 = FORMAT_STRING;
      break;
    case 'u':
      FVar20 = FORMAT_LONGU - ((uVar31 & 0x20) == 0);
      if ((uVar31 & 0x40) != 0) {
        FVar20 = FORMAT_LONGLONGU;
      }
      uVar31 = uVar31 | 0x200;
      break;
    case 'x':
      uVar31 = uVar31 | 0xa00;
LAB_0013dcd5:
      FVar20 = FORMAT_INTU;
      break;
    default:
      if (cVar2 == 'E') {
        uVar31 = uVar31 | 0x41000;
      }
      else {
        if (cVar2 != 'G') {
          if (cVar2 == 'X') {
            uVar31 = uVar31 | 0x1a00;
            goto LAB_0013dcd5;
          }
          if (cVar2 == 'S') {
            uVar31 = uVar31 | 8;
            goto LAB_0013ded1;
          }
          goto switchD_0013db80_caseD_68;
        }
        uVar31 = uVar31 | 0x81000;
      }
LAB_0013dcf3:
      FVar20 = FORMAT_DOUBLE;
    }
    local_1a00 = local_1a00 + ~(ulong)format;
    if ((uVar31 >> 0xe & 1) != 0) {
      if ((int)uVar13 < 0) {
        uVar13 = local_19c0;
        local_19c0 = local_19c0 + 1;
      }
      else if (((byte)work[uVar15 >> 3] >> (uVar13 & 7) & 1) != 0) {
        return 0;
      }
      if (0x7f < (int)uVar13) {
        return 0;
      }
      if ((int)local_19e0 < (int)uVar13) {
        local_19e0 = uVar13;
      }
      input[(int)uVar13].type = FORMAT_WIDTH;
      work[(int)uVar13 / 8] = work[(int)uVar13 / 8] | (byte)(1 << ((byte)uVar13 & 7));
    }
    if ((uVar31 >> 0x10 & 1) != 0) {
      if ((int)uVar7 < 0) {
        uVar27 = local_19c0 + 1;
        uVar7 = local_19c0;
      }
      else {
        uVar27 = local_19c0;
        if (((byte)work[uVar7 >> 3] >> (uVar7 & 7) & 1) != 0) {
          return 0;
        }
      }
      local_19c0 = uVar27;
      if (0x7f < (int)uVar7) {
        return 0;
      }
      if ((int)local_19e0 < (int)uVar7) {
        local_19e0 = uVar7;
      }
      input[(int)uVar7].type = FORMAT_PRECISION;
      work[(int)uVar7 / 8] = work[(int)uVar7 / 8] | (byte)(1 << ((byte)uVar7 & 7));
    }
    uVar27 = uVar6;
    if ((int)uVar6 < 0) {
      uVar27 = local_19c0;
    }
    if (0x7f < (int)uVar27) {
      return 0;
    }
    input[(int)uVar27].type = FVar20;
    work[(int)uVar27 / 8] = work[(int)uVar27 / 8] | (byte)(1 << ((byte)uVar27 & 7));
    formatbuf._0_8_ = formatbuf._0_8_ + 1;
    if (0x7f < (int)uVar16) {
      return 0;
    }
    local_19c0 = local_19c0 - ((int)uVar6 >> 0x1f);
    if ((int)local_19e0 < (int)uVar27) {
      local_19e0 = uVar27;
    }
    output[(int)uVar16].input = uVar27;
    output[(int)uVar16].flags = uVar31;
    output[(int)uVar16].width = uVar13;
    output[(int)uVar16].precision = uVar7;
    output[(int)uVar16].start = format;
    output[(int)uVar16].outlen = (size_t)local_1a00;
    format = (char *)formatbuf._0_8_;
    uVar16 = uVar16 + 1;
    goto switchD_0013db80_caseD_68;
  }
  if (*(char *)formatbuf._0_8_ != '\0') goto code_r0x0013dbb8;
  uVar8 = uVar16;
  if (formatbuf._0_8_ - (long)format != 0) {
    if (0x7f < (int)uVar16) {
      return 0;
    }
    uVar8 = uVar16 + 1;
    output[(int)uVar16].flags = 0x100000;
    output[(int)uVar16].input = 0;
    output[(int)uVar16].start = format;
    output[(int)uVar16].outlen = formatbuf._0_8_ - (long)format;
  }
  if ((int)local_19e0 < 0) {
    local_19e0 = 0xffffffff;
  }
  paVar14 = &input[0].val;
  for (uVar15 = 0; (long)(int)local_19e0 + 1U != uVar15; uVar15 = uVar15 + 1) {
    if (((byte)work[uVar15 >> 3 & 0x1fffffff] >> ((uint)uVar15 & 7) & 1) == 0) {
      return 0;
    }
    switch(((va_input *)(paVar14 + -1))->type) {
    case FORMAT_STRING:
    case FORMAT_PTR:
    case FORMAT_INTPTR:
    case FORMAT_LONG:
    case FORMAT_LONGLONG:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      uVar16 = ap_save->gp_offset;
      if ((ulong)uVar16 < 0x29) {
        paVar24 = (anon_union_8_5_b978c7c5_for_val *)((ulong)uVar16 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar16 + 8;
      }
      else {
        paVar24 = (anon_union_8_5_b978c7c5_for_val *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = paVar24 + 1;
      }
      aVar22 = *paVar24;
      break;
    case FORMAT_INT:
    case FORMAT_WIDTH:
    case FORMAT_PRECISION:
      uVar16 = ap_save->gp_offset;
      if ((ulong)uVar16 < 0x29) {
        piVar21 = (int *)((ulong)uVar16 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar16 + 8;
      }
      else {
        piVar21 = (int *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = piVar21 + 2;
      }
      aVar22 = (anon_union_8_5_b978c7c5_for_val)(long)*piVar21;
      break;
    case FORMAT_INTU:
      uVar16 = ap_save->gp_offset;
      if ((ulong)uVar16 < 0x29) {
        puVar23 = (uint *)((ulong)uVar16 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar16 + 8;
      }
      else {
        puVar23 = (uint *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = puVar23 + 2;
      }
      aVar22.nums._4_4_ = 0;
      aVar22.nums._0_4_ = *puVar23;
      break;
    case FORMAT_DOUBLE:
      uVar16 = ap_save->fp_offset;
      if ((ulong)uVar16 < 0xa1) {
        paVar24 = (anon_union_8_5_b978c7c5_for_val *)((ulong)uVar16 + (long)ap_save->reg_save_area);
        ap_save->fp_offset = uVar16 + 0x10;
      }
      else {
        paVar24 = (anon_union_8_5_b978c7c5_for_val *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = paVar24 + 1;
      }
      *paVar14 = *paVar24;
    default:
      goto switchD_0013df85_caseD_a;
    }
    *paVar14 = aVar22;
switchD_0013df85_caseD_a:
    paVar14 = paVar14 + 2;
  }
  uVar15 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar15 = 0;
  }
  uVar18 = 0;
  iVar10 = 0;
  local_19d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
  do {
    if (uVar18 == uVar15) {
      return iVar10;
    }
    sVar19 = output[uVar18].outlen;
    local_1a04 = output[uVar18].flags;
    iVar32 = iVar10;
    if (sVar19 != 0) {
      pcVar30 = output[uVar18].start;
      for (sVar28 = 0; iVar32 = (int)sVar19, sVar19 != sVar28; sVar28 = sVar28 + 1) {
        iVar32 = (int)sVar28;
        if (pcVar30[sVar28] == '\0') break;
        iVar9 = (*stream)(pcVar30[sVar28],userp);
        if (iVar9 != 0) {
          return iVar10 + iVar32;
        }
      }
      iVar10 = iVar10 + iVar32;
      iVar32 = iVar10;
      if ((local_1a04 >> 0x14 & 1) == 0) goto LAB_0013e0ee;
      goto LAB_0013e966;
    }
LAB_0013e0ee:
    uVar8 = output[uVar18].width;
    if ((local_1a04 >> 0xe & 1) == 0) {
      uVar29 = (ulong)uVar8;
    }
    else {
      uVar16 = *(uint *)&input[(int)uVar8].val;
      uVar29 = (ulong)uVar16;
      if ((int)uVar16 < 0) {
        uVar29 = (ulong)-uVar16;
        local_1a04 = local_1a04 & 0xfffffefb | 4;
      }
    }
    if ((local_1a04 >> 0x10 & 1) == 0) {
      uVar16 = 0xffffffff;
      if ((short)local_1a04 < 0) {
        uVar16 = output[uVar18].precision;
      }
    }
    else {
      uVar16 = *(uint *)&input[output[uVar18].precision].val;
      if ((int)*(uint *)&input[output[uVar18].precision].val < 0) {
        uVar16 = 0xffffffff;
      }
    }
    uVar6 = output[uVar18].input;
    iVar10 = iVar32;
    if (FORMAT_DOUBLE < input[uVar6].type) goto LAB_0013e966;
    uVar7 = local_1a04 & 8;
    iVar9 = (int)uVar29;
    switch(input[uVar6].type) {
    case FORMAT_STRING:
      pcVar30 = input[uVar6].val.str;
      if (pcVar30 == (char *)0x0) {
        if (uVar16 == 0xffffffff || 4 < (int)uVar16) {
          local_1a04 = local_1a04 & 0xfffffff7;
          uVar7 = 0;
          pcVar30 = "(nil)";
          uVar29 = 5;
        }
        else {
          pcVar30 = "";
LAB_0013e80b:
          uVar29 = 0;
        }
      }
      else if (uVar16 == 0xffffffff) {
        if (*pcVar30 == '\0') goto LAB_0013e80b;
        uVar29 = strlen(pcVar30);
      }
      else {
        uVar29 = (ulong)(int)uVar16;
      }
      uVar12 = 0x7fffffff;
      if (uVar29 < 0x7fffffff) {
        uVar12 = uVar29;
      }
      if (uVar7 != 0) {
        iVar10 = (*stream)('\"',userp);
        if (iVar10 != 0) {
          return iVar32;
        }
        iVar32 = iVar32 + 1;
      }
      uVar16 = iVar9 - (int)uVar12;
      uVar8 = uVar16;
      if ((local_1a04 & 4) == 0) {
        uVar8 = ((int)uVar16 >> 0x1f & uVar16) - 1;
        for (; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
          iVar10 = (*stream)(' ',userp);
          if (iVar10 != 0) {
            return iVar32;
          }
          iVar32 = iVar32 + 1;
        }
      }
      for (uVar12 = 0; iVar10 = (int)uVar29, uVar29 != uVar12; uVar12 = uVar12 + 1) {
        iVar10 = (int)uVar12;
        if (pcVar30[uVar12] == '\0') break;
        iVar9 = (*stream)(pcVar30[uVar12],userp);
        if (iVar9 != 0) {
          return iVar32 + iVar10;
        }
      }
      iVar10 = iVar10 + iVar32;
      if ((local_1a04 & 4) != 0) {
        for (; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
          iVar32 = (*stream)(' ',userp);
          if (iVar32 != 0) {
            return iVar10;
          }
          iVar10 = iVar10 + 1;
        }
      }
      if (uVar7 != 0) {
        iVar32 = (*stream)('\"',userp);
        if (iVar32 != 0) {
          return iVar10;
        }
        iVar10 = iVar10 + 1;
      }
      break;
    case FORMAT_PTR:
      uVar12 = input[uVar6].val.numu;
      if (uVar12 == 0) {
        uVar16 = iVar9 - 5;
        uVar8 = uVar16;
        if ((local_1a04 & 4) != 0) {
          uVar8 = ((int)uVar16 >> 0x1f & uVar16) - 1;
          for (; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
            iVar10 = (*stream)(' ',userp);
            if (iVar10 != 0) {
              return iVar32;
            }
            iVar32 = iVar32 + 1;
          }
        }
        iVar10 = iVar32 + 5;
        for (lVar17 = 0; lVar17 != 5; lVar17 = lVar17 + 1) {
          iVar9 = (*stream)("(nil)"[lVar17],userp);
          if (iVar9 != 0) {
            return iVar32 + (int)lVar17;
          }
        }
        if ((local_1a04 & 4) == 0) {
          for (; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
            iVar32 = (*stream)(' ',userp);
            if (iVar32 != 0) {
              return iVar10;
            }
            iVar10 = iVar10 + 1;
          }
        }
        break;
      }
      local_19d8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
      if ((local_1a04 >> 0xc & 1) == 0) {
        local_19d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
      }
      bVar25 = 1;
      bVar3 = false;
      uStack_1a10 = 0x10;
      bVar5 = 1;
      goto LAB_0013e491;
    case FORMAT_INTPTR:
      if (((local_1a04 & 0x40) == 0) && ((local_1a04 & 0x20) == 0)) {
        if ((local_1a04 & 0x10) == 0) {
          *(int *)input[uVar6].val.str = iVar32;
        }
        else {
          *(short *)input[uVar6].val.str = (short)iVar32;
        }
      }
      else {
        *(long *)input[uVar6].val.str = (long)iVar32;
      }
      break;
    default:
      goto switchD_0013e194_caseD_3;
    case FORMAT_INTU:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      local_1a04 = local_1a04 | 0x200;
switchD_0013e194_caseD_3:
      uVar12 = input[uVar6].val.numu;
      if ((local_1a04 >> 0x11 & 1) == 0) {
        bVar5 = (byte)(uVar7 >> 3);
        if ((local_1a04 >> 10 & 1) == 0) {
          if ((local_1a04 >> 0xb & 1) != 0) {
            local_19d8 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
            if ((local_1a04 >> 0xc & 1) == 0) {
              local_19d8 = "0123456789abcdefghijklmnopqrstuvwxyz";
            }
            bVar25 = 1;
            bVar3 = false;
            uStack_1a10 = 0x10;
            goto LAB_0013e491;
          }
          uVar29 = -uVar12;
          if (0 < (long)uVar12) {
            uVar29 = uVar12;
          }
          local_19c8 = (local_1a04 >> 9 & 1) == 0;
          if (!local_19c8) {
            uVar29 = uVar12;
          }
          local_19c8 = local_19c8 && (long)uVar12 < 0;
          if (uVar16 == 0xffffffff) {
            uVar16 = 1;
          }
          lVar17 = 0x144;
          for (; uVar29 != 0; uVar29 = uVar29 / 10) {
            work[lVar17] = (byte)(uVar29 % 10) | 0x30;
            lVar17 = lVar17 + -1;
          }
          bVar25 = 0;
          bVar3 = false;
        }
        else {
          bVar3 = true;
          bVar25 = 0;
          uStack_1a10 = 8;
LAB_0013e491:
          if (uVar16 == 0xffffffff) {
            uVar16 = 1;
          }
          lVar17 = 0x144;
          for (; uVar12 != 0; uVar12 = uVar12 / uStack_1a10) {
            work[lVar17] = local_19d8[uVar12 & uStack_1a10 - 1];
            lVar17 = lVar17 + -1;
          }
          local_19c8 = false;
        }
        iVar10 = 0x144 - (int)lVar17;
        iVar9 = iVar9 - iVar10;
        iVar10 = uVar16 - iVar10;
        if (((bVar3) && (bVar5 != 0)) && (iVar10 < 1)) {
          work[lVar17] = '0';
          lVar17 = lVar17 + -1;
          iVar9 = iVar9 + -1;
        }
        else if (0 < iVar10) {
          for (; (0 < (int)((uVar16 - 0x144) + (int)lVar17) && (-1 < lVar17)); lVar17 = lVar17 + -1)
          {
            work[lVar17] = '0';
          }
          iVar9 = iVar9 - iVar10;
        }
        iVar10 = iVar9 + -2;
        if ((bVar25 & bVar5) == 0) {
          iVar10 = iVar9;
        }
        uVar16 = iVar10 - (uint)(byte)((local_1a04 & 3) != 0 | local_19c8);
        uVar8 = uVar16;
        if ((local_1a04 & 0x104) == 0) {
          uVar8 = ((int)uVar16 >> 0x1f & uVar16) - 1;
          for (; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
            iVar10 = (*stream)(' ',userp);
            if (iVar10 != 0) {
              return iVar32;
            }
            iVar32 = iVar32 + 1;
          }
        }
        if (local_19c8 == false) {
          if ((local_1a04 & 2) != 0) {
            uStack_1a10._0_1_ = '+';
            goto LAB_0013e5bb;
          }
          if ((local_1a04 & 1) != 0) {
            uStack_1a10._0_1_ = ' ';
            goto LAB_0013e5bb;
          }
        }
        else {
          uStack_1a10._0_1_ = '-';
LAB_0013e5bb:
          iVar10 = (*stream)((uchar)uStack_1a10,userp);
          if (iVar10 != 0) {
            return iVar32;
          }
          iVar32 = iVar32 + 1;
        }
        if ((bVar25 & bVar5) != 0) {
          iVar10 = (*stream)('0',userp);
          if (iVar10 != 0) {
            return iVar32;
          }
          if ((local_1a04 >> 0xc & 1) == 0) {
            uStack_1a10._0_1_ = 'x';
          }
          else {
            uStack_1a10._0_1_ = 'X';
          }
          iVar10 = (*stream)((uchar)uStack_1a10,userp);
          if (iVar10 != 0) {
            return iVar32 + 1;
          }
          iVar32 = iVar32 + 2;
        }
        iVar10 = iVar32;
        uVar16 = uVar8;
        if ((local_1a04 & 0x104) == 0x100) {
          uVar16 = ((int)uVar8 >> 0x1f & uVar8) - 1;
          for (; iVar10 = iVar32, 0 < (int)uVar8; uVar8 = uVar8 - 1) {
            iVar10 = (*stream)('0',userp);
            if (iVar10 != 0) {
              return iVar32;
            }
            iVar32 = iVar32 + 1;
          }
        }
        for (; lVar17 < 0x144; lVar17 = lVar17 + 1) {
          iVar32 = (*stream)(work[lVar17 + 1],userp);
          if (iVar32 != 0) {
            return iVar10;
          }
          iVar10 = iVar10 + 1;
        }
        if ((local_1a04 & 4) != 0) {
          for (iVar32 = 0; 0 < (int)(uVar16 + iVar32); iVar32 = iVar32 + -1) {
            iVar9 = (*stream)(' ',userp);
            if (iVar9 != 0) {
              return iVar10 - iVar32;
            }
          }
          iVar10 = iVar10 - iVar32;
        }
      }
      else {
        if ((local_1a04 & 4) == 0) {
          while (iVar10 = (int)uVar29, 1 < iVar10) {
            iVar9 = (*stream)(' ',userp);
            if (iVar9 != 0) {
              return iVar32;
            }
            iVar32 = iVar32 + 1;
            uVar29 = (ulong)(iVar10 - 1);
          }
          uVar29 = (ulong)(iVar10 - 1);
        }
        iVar10 = (*stream)((uchar)uVar12,userp);
        if (iVar10 != 0) {
          return iVar32;
        }
        iVar10 = iVar32 + 1;
        if ((local_1a04 & 4) != 0) {
          for (; 1 < (int)uVar29; uVar29 = (ulong)((int)uVar29 - 1)) {
            iVar32 = (*stream)(' ',userp);
            if (iVar32 != 0) {
              return iVar10;
            }
            iVar10 = iVar10 + 1;
          }
        }
      }
      break;
    case FORMAT_DOUBLE:
      formatbuf[0x10] = '\0';
      formatbuf[0x11] = '\0';
      formatbuf[0x12] = '\0';
      formatbuf[0x13] = '\0';
      formatbuf[0x14] = '\0';
      formatbuf[0x15] = '\0';
      formatbuf[0x16] = '\0';
      formatbuf[0x17] = '\0';
      formatbuf[0x18] = '\0';
      formatbuf[0x19] = '\0';
      formatbuf[0x1a] = '\0';
      formatbuf[0x1b] = '\0';
      formatbuf[0x1c] = '\0';
      formatbuf[0x1d] = '\0';
      formatbuf[0x1e] = '\0';
      formatbuf[0x1f] = '\0';
      formatbuf[0] = '%';
      formatbuf[1] = '\0';
      formatbuf[2] = '\0';
      formatbuf[3] = '\0';
      formatbuf[4] = '\0';
      formatbuf[5] = '\0';
      formatbuf[6] = '\0';
      formatbuf[7] = '\0';
      formatbuf[8] = '\0';
      formatbuf[9] = '\0';
      formatbuf[10] = '\0';
      formatbuf[0xb] = '\0';
      formatbuf[0xc] = '\0';
      formatbuf[0xd] = '\0';
      formatbuf[0xe] = '\0';
      formatbuf[0xf] = '\0';
      sVar11 = strlen(formatbuf);
      uVar12 = (ulong)uVar8;
      if ((local_1a04 >> 0xd & 1) == 0) {
        uVar12 = uVar29;
      }
      uVar8 = (uint)uVar12;
      if ((short)local_1a04 < 0) {
        uVar16 = output[uVar18].precision;
      }
      buffer = (byte *)(formatbuf + 1);
      if ((local_1a04 & 4) != 0) {
        formatbuf[1] = '-';
        buffer = (byte *)(formatbuf + 2);
      }
      if ((local_1a04 & 2) != 0) {
        *buffer = 0x2b;
        buffer = buffer + 1;
      }
      if ((local_1a04 & 1) != 0) {
        *buffer = 0x20;
        buffer = buffer + 1;
      }
      if (uVar7 != 0) {
        *buffer = 0x23;
        buffer = buffer + 1;
      }
      sVar19 = 0x20 - sVar11;
      *buffer = 0;
      if (-1 < (int)uVar8) {
        if (0x144 < uVar8) {
          uVar12 = 0x145;
        }
        uVar8 = (uint)uVar12;
        iVar10 = curl_msnprintf((char *)buffer,sVar19,"%d",uVar12);
        buffer = buffer + iVar10;
        sVar19 = sVar19 - (long)iVar10;
      }
      if (-1 < (int)uVar16) {
        iVar10 = 0x144 - uVar8;
        if ((int)uVar8 < (int)uVar16) {
          iVar10 = 0x144;
        }
        dVar1 = input[uVar6].val.dnum;
        if ((int)uVar8 < 1) {
          iVar10 = 0x144;
        }
        for (; 10.0 <= dVar1; dVar1 = dVar1 / 10.0) {
          iVar10 = iVar10 + -1;
        }
        uVar8 = iVar10 - 1;
        if ((int)uVar16 <= iVar10) {
          uVar8 = uVar16;
        }
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        iVar10 = curl_msnprintf((char *)buffer,sVar19,".%d",(ulong)uVar8);
        buffer = buffer + iVar10;
      }
      if ((local_1a04 & 0x20) != 0) {
        *buffer = 0x6c;
        buffer = buffer + 1;
      }
      if ((local_1a04 >> 0x12 & 1) == 0) {
        bVar5 = 0x66;
        if ((local_1a04 >> 0x13 & 1) != 0) {
          bVar5 = ((local_1a04 >> 0xc & 1) == 0) << 5 | 0x47;
        }
      }
      else {
        bVar5 = ((local_1a04 >> 0xc & 1) == 0) << 5 | 0x45;
      }
      *buffer = bVar5;
      buffer[1] = 0;
      __s = (uchar *)work;
      snprintf((char *)__s,0x146,formatbuf,(int)input[uVar6].val.nums);
      for (; iVar10 = iVar32, *__s != '\0'; __s = __s + 1) {
        iVar10 = (*stream)(*__s,userp);
        if (iVar10 != 0) {
          return iVar32;
        }
        iVar32 = iVar32 + 1;
      }
    }
LAB_0013e966:
    uVar18 = uVar18 + 1;
  } while( true );
code_r0x0013dbb8:
  formatbuf._0_8_ = formatbuf._0_8_ + 1;
  goto switchD_0013db80_caseD_68;
}

Assistant:

static int formatf(
  void *userp, /* untouched by format(), just sent to the stream() function in
                  the second argument */
  /* function pointer called for each output character */
  int (*stream)(unsigned char, void *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  static const char nilstr[] = "(nil)";
  const char *digits = lower_digits;   /* Base-36 digits for numbers.  */
  int done = 0;   /* number of characters written  */
  int i;
  int ocount = 0; /* number of output segments */
  int icount = 0; /* number of input arguments */

  struct outsegment output[MAX_SEGMENTS];
  struct va_input input[MAX_PARAMETERS];
  char work[BUFFSIZE];

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (FALSE?) warning Coverity gives us
     otherwise */
  char *workend = &work[sizeof(work) - 2];

  /* Parse the format string */
  if(parsefmt(format, output, input, &ocount, &icount, ap_save))
    return 0;

  for(i = 0; i < ocount; i++) {
    struct outsegment *optr = &output[i];
    struct va_input *iptr;
    bool is_alt;            /* Format spec modifiers.  */
    int width;              /* Width of a field.  */
    int prec;               /* Precision of a field.  */
    bool is_neg;            /* Decimal integer is negative.  */
    unsigned long base;     /* Base of a number to be written.  */
    mp_uintmax_t num;       /* Integral values to be written.  */
    mp_intmax_t signed_num; /* Used to convert negative in positive.  */
    char *w;
    size_t outlen = optr->outlen;
    unsigned int flags = optr->flags;

    if(outlen) {
      char *str = optr->start;
      for(; outlen && *str; outlen--)
        OUTCHAR(*str++);
      if(optr->flags & FLAGS_SUBSTR)
        /* this is just a substring */
        continue;
    }

    /* pick up the specified width */
    if(flags & FLAGS_WIDTHPARAM) {
      width = (int)input[optr->width].val.nums;
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        if(width == INT_MIN)
          width = INT_MAX;
        else
          width = -width;
        flags |= FLAGS_LEFT;
        flags &= ~(unsigned int)FLAGS_PAD_NIL;
      }
    }
    else
      width = optr->width;

    /* pick up the specified precision */
    if(flags & FLAGS_PRECPARAM) {
      prec = (int)input[optr->precision].val.nums;
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(flags & FLAGS_PREC)
      prec = optr->precision;
    else
      prec = -1;

    is_alt = (flags & FLAGS_ALT) ? 1 : 0;
    iptr = &input[optr->input];

    switch(iptr->type) {
    case FORMAT_INTU:
    case FORMAT_LONGU:
    case FORMAT_LONGLONGU:
      flags |= FLAGS_UNSIGNED;
      FALLTHROUGH();
    case FORMAT_INT:
    case FORMAT_LONG:
    case FORMAT_LONGLONG:
      num = iptr->val.numu;
      if(flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(flags & FLAGS_OCTAL) {
        /* Octal unsigned integer */
        base = 8;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer */
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        base = 16;
        is_neg = FALSE;
      }
      else if(flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer */
        base = 10;
        is_neg = FALSE;
      }
      else {
        /* Decimal integer.  */
        base = 10;

        is_neg = (iptr->val.nums < (mp_intmax_t)0);
        if(is_neg) {
          /* signed_num might fail to hold absolute negative minimum by 1 */
          signed_num = iptr->val.nums + (mp_intmax_t)1;
          signed_num = -signed_num;
          num = (mp_uintmax_t)signed_num;
          num += (mp_uintmax_t)1;
        }
      }
number:
      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      switch(base) {
      case 10:
        while(num > 0) {
          *w-- = (char)('0' + (num % 10));
          num /= 10;
        }
        break;
      default:
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        break;
      }
      width -= (int)(workend - w);
      prec -= (int)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0 && w >= work)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (flags & FLAGS_SHOWSIGN) || (flags & FLAGS_SPACE))
        --width;

      if(!(flags & FLAGS_LEFT) && !(flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(flags & FLAGS_LEFT) && (flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING: {
      const char *str;
      size_t len;

      str = (char *)iptr->val.str;
      if(!str) {
        /* Write null string if there is space.  */
        if(prec == -1 || prec >= (int) sizeof(nilstr) - 1) {
          str = nilstr;
          len = sizeof(nilstr) - 1;
          /* Disable quotes around (nil) */
          flags &= ~(unsigned int)FLAGS_ALT;
        }
        else {
          str = "";
          len = 0;
        }
      }
      else if(prec != -1)
        len = (size_t)prec;
      else if(*str == '\0')
        len = 0;
      else
        len = strlen(str);

      width -= (len > INT_MAX) ? INT_MAX : (int)len;

      if(flags & FLAGS_ALT)
        OUTCHAR('"');

      if(!(flags & FLAGS_LEFT))
        while(width-- > 0)
          OUTCHAR(' ');

      for(; len && *str; len--)
        OUTCHAR(*str++);
      if(flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');

      if(flags & FLAGS_ALT)
        OUTCHAR('"');
      break;
    }

    case FORMAT_PTR:
      /* Generic pointer.  */
      if(iptr->val.ptr) {
        /* If the pointer is not NULL, write it as a %#x spec.  */
        base = 16;
        digits = (flags & FLAGS_UPPER) ? upper_digits : lower_digits;
        is_alt = TRUE;
        num = (size_t) iptr->val.ptr;
        is_neg = FALSE;
        goto number;
      }
      else {
        /* Write "(nil)" for a nil pointer.  */
        const char *point;

        width -= (int)(sizeof(nilstr) - 1);
        if(flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
        for(point = nilstr; *point != '\0'; ++point)
          OUTCHAR(*point);
        if(!(flags & FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_DOUBLE: {
      char formatbuf[32]="%";
      char *fptr = &formatbuf[1];
      size_t left = sizeof(formatbuf)-strlen(formatbuf);
      int len;

      if(flags & FLAGS_WIDTH)
        width = optr->width;

      if(flags & FLAGS_PREC)
        prec = optr->precision;

      if(flags & FLAGS_LEFT)
        *fptr++ = '-';
      if(flags & FLAGS_SHOWSIGN)
        *fptr++ = '+';
      if(flags & FLAGS_SPACE)
        *fptr++ = ' ';
      if(flags & FLAGS_ALT)
        *fptr++ = '#';

      *fptr = 0;

      if(width >= 0) {
        size_t dlen;
        if(width >= (int)sizeof(work))
          width = sizeof(work)-1;
        /* RECURSIVE USAGE */
        dlen = (size_t)curl_msnprintf(fptr, left, "%d", width);
        fptr += dlen;
        left -= dlen;
      }
      if(prec >= 0) {
        /* for each digit in the integer part, we can have one less
           precision */
        size_t maxprec = sizeof(work) - 2;
        double val = iptr->val.dnum;
        if(width > 0 && prec <= width)
          maxprec -= (size_t)width;
        while(val >= 10.0) {
          val /= 10;
          maxprec--;
        }

        if(prec > (int)maxprec)
          prec = (int)maxprec-1;
        if(prec < 0)
          prec = 0;
        /* RECURSIVE USAGE */
        len = curl_msnprintf(fptr, left, ".%d", prec);
        fptr += len;
      }
      if(flags & FLAGS_LONG)
        *fptr++ = 'l';

      if(flags & FLAGS_FLOATE)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'E' : 'e');
      else if(flags & FLAGS_FLOATG)
        *fptr++ = (char)((flags & FLAGS_UPPER) ? 'G' : 'g');
      else
        *fptr++ = 'f';

      *fptr = 0; /* and a final null-termination */

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
      /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
         output characters */
#ifdef HAVE_SNPRINTF
      (snprintf)(work, sizeof(work), formatbuf, iptr->val.dnum);
#else
      (sprintf)(work, formatbuf, iptr->val.dnum);
#endif
#ifdef __clang__
#pragma clang diagnostic pop
#endif
      DEBUGASSERT(strlen(work) <= sizeof(work));
      for(fptr = work; *fptr; fptr++)
        OUTCHAR(*fptr);
      break;
    }

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) iptr->val.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(flags & FLAGS_LONG)
          *(long *) iptr->val.ptr = (long)done;
      else if(!(flags & FLAGS_SHORT))
        *(int *) iptr->val.ptr = (int)done;
      else
        *(short *) iptr->val.ptr = (short)done;
      break;

    default:
      break;
    }
  }
  return done;
}